

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O3

LengthPercentageAuto
Rml::ComputeLengthPercentageAuto
          (Property *property,float font_size,float document_font_size,float dp_ratio,
          Vector2f vp_dimensions)

{
  NumericValue value;
  ulong uVar1;
  undefined4 in_XMM3_Dc;
  undefined4 in_XMM3_Dd;
  float local_1c;
  undefined1 local_18 [16];
  
  if (property->unit == KEYWORD) {
    local_1c = 0.0;
    uVar1 = 0;
  }
  else if (property->unit == PERCENT) {
    local_1c = 0.0;
    Variant::GetInto<float,_0>(&property->value,&local_1c);
    uVar1 = 2;
  }
  else {
    local_18._8_4_ = in_XMM3_Dc;
    local_18._0_8_ = vp_dimensions;
    local_18._12_4_ = in_XMM3_Dd;
    value = Property::GetNumericValue(property);
    local_1c = ComputeLength(value,font_size,document_font_size,dp_ratio,(Vector2f)local_18._0_8_);
    uVar1 = 1;
  }
  return (LengthPercentageAuto)((ulong)(uint)local_1c << 0x20 | uVar1);
}

Assistant:

Style::LengthPercentageAuto ComputeLengthPercentageAuto(const Property* property, float font_size, float document_font_size, float dp_ratio,
	Vector2f vp_dimensions)
{
	using namespace Style;
	if (property->unit == Unit::PERCENT)
		return LengthPercentageAuto(LengthPercentageAuto::Percentage, property->Get<float>());
	else if (property->unit == Unit::KEYWORD)
		return LengthPercentageAuto(LengthPercentageAuto::Auto);

	return LengthPercentageAuto(LengthPercentageAuto::Length,
		ComputeLength(property->GetNumericValue(), font_size, document_font_size, dp_ratio, vp_dimensions));
}